

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextBlock>::moveAppend
          (QGenericArrayOps<QTextBlock> *this,QTextBlock *b,QTextBlock *e)

{
  QTextBlock *pQVar1;
  QTextBlock *in_RDX;
  QTextBlock *in_RSI;
  long in_RDI;
  QTextBlock *data;
  QTextBlock *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QTextBlock>::begin((QArrayDataPointer<QTextBlock> *)0x890a67);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextBlock::QTextBlock(pQVar1 + *(long *)(in_RDI + 0x10),local_10);
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }